

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

BBox * __thiscall CGL::GLScene::Mesh::get_bbox(BBox *__return_storage_ptr__,Mesh *this)

{
  _List_node_base *p_Var1;
  list<CGL::Vertex,_std::allocator<CGL::Vertex>_> *plVar2;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_48;
  
  BBox::BBox(__return_storage_ptr__);
  plVar2 = &(this->mesh).vertices;
  p_Var1 = (_List_node_base *)plVar2;
  while (p_Var1 = (((_List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_> *)&p_Var1->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)plVar2) {
    local_48.field_0.x = (double)p_Var1[2]._M_next;
    local_48.field_0.y = (double)p_Var1[2]._M_prev;
    local_48.field_0.z = (double)p_Var1[3]._M_next;
    BBox::expand(__return_storage_ptr__,(Vector3D *)&local_48.field_0);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox Mesh::get_bbox() {
  BBox bbox;
  for (VertexIter it = mesh.verticesBegin(); it != mesh.verticesEnd(); it++) {
    bbox.expand(it->position);
  }
  return bbox;
}